

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFactoryRegistry.cpp
# Opt level: O1

void __thiscall tcu::GenericFactoryRegistry::~GenericFactoryRegistry(GenericFactoryRegistry *this)

{
  pointer ppAVar1;
  
  ppAVar1 = (this->m_factories).
            super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar1 !=
      (this->m_factories).
      super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (*ppAVar1 != (AbstractFactory *)0x0) {
        (*(*ppAVar1)->_vptr_AbstractFactory[1])();
      }
      ppAVar1 = ppAVar1 + 1;
    } while (ppAVar1 !=
             (this->m_factories).
             super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ppAVar1 = (this->m_factories).
            super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar1 != (pointer)0x0) {
    operator_delete(ppAVar1,(long)(this->m_factories).
                                  super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar1
                   );
    return;
  }
  return;
}

Assistant:

GenericFactoryRegistry::~GenericFactoryRegistry (void)
{
	for (std::vector<AbstractFactory*>::const_iterator i = m_factories.begin(); i != m_factories.end(); ++i)
		delete *i;
}